

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_Single_Test::TestBody
          (MessageDifferencerTest_IgnoreField_Single_Test *this)

{
  FieldDescriptor *field;
  allocator<char> local_2a1;
  string local_2a0;
  undefined1 local_280 [8];
  MessageDifferencer differencer;
  undefined1 local_c0 [8];
  TestField msg2;
  TestField msg1;
  MessageDifferencerTest_IgnoreField_Single_Test *this_local;
  
  proto2_unittest::TestField::TestField((TestField *)((long)&msg2.field_0 + 0x40));
  proto2_unittest::TestField::TestField((TestField *)local_c0);
  proto2_unittest::TestField::set_c((TestField *)((long)&msg2.field_0 + 0x40),3);
  proto2_unittest::TestField::add_rc((TestField *)((long)&msg2.field_0 + 0x40),1);
  proto2_unittest::TestField::set_c((TestField *)local_c0,5);
  proto2_unittest::TestField::add_rc((TestField *)local_c0,1);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"c",&local_2a1);
  field = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0x40),&local_2a0);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)local_280,field);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  ExpectEqualsWithDifferencer
            ((MessageDifferencer *)local_280,(Message *)((long)&msg2.field_0 + 0x40),
             (Message *)local_c0);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_280);
  proto2_unittest::TestField::~TestField((TestField *)local_c0);
  proto2_unittest::TestField::~TestField((TestField *)((long)&msg2.field_0 + 0x40));
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_Single) {
  proto2_unittest::TestField msg1;
  proto2_unittest::TestField msg2;

  msg1.set_c(3);
  msg1.add_rc(1);

  msg2.set_c(5);
  msg2.add_rc(1);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(GetFieldDescriptor(msg1, "c"));

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}